

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O0

CURLcode Curl_base64_decode(char *src,uchar **outptr,size_t *outlen)

{
  size_t sVar1;
  size_t sVar2;
  uchar *puVar3;
  size_t sVar4;
  bool bVar5;
  size_t result;
  uchar *newstr;
  uchar *pos;
  size_t rawlen;
  size_t numQuantums;
  size_t i;
  size_t padding;
  size_t length;
  size_t srclen;
  size_t *outlen_local;
  uchar **outptr_local;
  char *src_local;
  
  padding = 0;
  i = 0;
  *outptr = (uchar *)0x0;
  *outlen = 0;
  sVar1 = strlen(src);
  if ((sVar1 == 0) || ((sVar1 & 3) != 0)) {
    src_local._4_4_ = CURLE_BAD_CONTENT_ENCODING;
  }
  else {
    while( true ) {
      bVar5 = false;
      if (src[padding] != '=') {
        bVar5 = src[padding] != '\0';
      }
      if (!bVar5) break;
      padding = padding + 1;
    }
    if ((src[padding] == '=') && (i = 1, src[padding + 1] == '=')) {
      i = 2;
    }
    if (padding + i == sVar1) {
      sVar2 = (sVar1 >> 2) * 3 - i;
      puVar3 = (uchar *)(*Curl_cmalloc)(sVar2 + 1);
      if (puVar3 == (uchar *)0x0) {
        src_local._4_4_ = CURLE_OUT_OF_MEMORY;
      }
      else {
        newstr = puVar3;
        outptr_local = (uchar **)src;
        for (numQuantums = 0; numQuantums < sVar1 >> 2; numQuantums = numQuantums + 1) {
          sVar4 = decodeQuantum(newstr,(char *)outptr_local);
          if (sVar4 == 0) {
            (*Curl_cfree)(puVar3);
            return CURLE_BAD_CONTENT_ENCODING;
          }
          newstr = newstr + sVar4;
          outptr_local = (uchar **)((long)outptr_local + 4);
        }
        *newstr = '\0';
        *outptr = puVar3;
        *outlen = sVar2;
        src_local._4_4_ = CURLE_OK;
      }
    }
    else {
      src_local._4_4_ = CURLE_BAD_CONTENT_ENCODING;
    }
  }
  return src_local._4_4_;
}

Assistant:

CURLcode Curl_base64_decode(const char *src,
                            unsigned char **outptr, size_t *outlen)
{
  size_t srclen = 0;
  size_t length = 0;
  size_t padding = 0;
  size_t i;
  size_t numQuantums;
  size_t rawlen = 0;
  unsigned char *pos;
  unsigned char *newstr;

  *outptr = NULL;
  *outlen = 0;
  srclen = strlen(src);

  /* Check the length of the input string is valid */
  if(!srclen || srclen % 4)
    return CURLE_BAD_CONTENT_ENCODING;

  /* Find the position of any = padding characters */
  while((src[length] != '=') && src[length])
    length++;

  /* A maximum of two = padding characters is allowed */
  if(src[length] == '=') {
    padding++;
    if(src[length + 1] == '=')
      padding++;
  }

  /* Check the = padding characters weren't part way through the input */
  if(length + padding != srclen)
    return CURLE_BAD_CONTENT_ENCODING;

  /* Calculate the number of quantums */
  numQuantums = srclen / 4;

  /* Calculate the size of the decoded string */
  rawlen = (numQuantums * 3) - padding;

  /* Allocate our buffer including room for a zero terminator */
  newstr = malloc(rawlen + 1);
  if(!newstr)
    return CURLE_OUT_OF_MEMORY;

  pos = newstr;

  /* Decode the quantums */
  for(i = 0; i < numQuantums; i++) {
    size_t result = decodeQuantum(pos, src);
    if(!result) {
      free(newstr);

      return CURLE_BAD_CONTENT_ENCODING;
    }

    pos += result;
    src += 4;
  }

  /* Zero terminate */
  *pos = '\0';

  /* Return the decoded data */
  *outptr = newstr;
  *outlen = rawlen;

  return CURLE_OK;
}